

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

bool dirIfIfn(aint *val)

{
  int iVar1;
  
  IsLabelNotFound = false;
  iVar1 = ParseExpression(&lp,val);
  if (iVar1 == 0) {
    Error("[IF/IFN] Syntax error",lp,IF_FIRST);
  }
  else if (IsLabelNotFound == true) {
    WarningById(W_FWD_REF,bp,W_EARLY);
  }
  return iVar1 != 0;
}

Assistant:

static bool dirIfIfn(aint & val) {
	IsLabelNotFound = false;
	if (!ParseExpression(lp, val)) {
		Error("[IF/IFN] Syntax error", lp, IF_FIRST);
		return false;
	}
	if (IsLabelNotFound) {
		WarningById(W_FWD_REF, bp, W_EARLY);
	}
	return true;
}